

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall
amrex::StateData::getData
          (StateData *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *data,
          Vector<double,_std::allocator<double>_> *datatime,Real time)

{
  double dVar1;
  bool bVar2;
  TimeCenter TVar3;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  StateDescriptor *this_00;
  literals *this_01;
  double in_XMM0_Qa;
  Real RVar4;
  double dVar5;
  Real teps_1;
  Real teps;
  value_type *in_stack_ffffffffffffff28;
  value_type *ppMVar6;
  undefined2 in_stack_ffffffffffffff30;
  undefined2 uVar7;
  undefined6 in_stack_ffffffffffffff32;
  value_type_conflict1 *in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::clear
            ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x11189c2);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x11189cf);
  this_00 = *(StateDescriptor **)(in_RDI + 8);
  TVar3 = StateDescriptor::timeType(this_00);
  if (TVar3 == Point) {
    this_01 = (literals *)(in_RDI + 0xd0);
    bVar2 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                            CONCAT62(in_stack_ffffffffffffff32,in_stack_ffffffffffffff30),
                            in_stack_ffffffffffffff28);
    if (bVar2) {
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 CONCAT62(in_stack_ffffffffffffff32,in_stack_ffffffffffffff30));
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT62(in_stack_ffffffffffffff32,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    else {
      dVar5 = *(double *)(in_RDI + 0xa8);
      dVar1 = *(double *)(in_RDI + 0xb8);
      ppMVar6 = SUB108(_DAT_016afc00,0);
      uVar7 = (undefined2)((unkuint10)_DAT_016afc00 >> 0x40);
      RVar4 = literals::operator____rt(this_01,_DAT_016afc00);
      dVar5 = (dVar5 - dVar1) * RVar4;
      if ((in_XMM0_Qa <= *(double *)(in_RDI + 0xa8) - dVar5) ||
         (*(double *)(in_RDI + 0xa8) + dVar5 <= in_XMM0_Qa)) {
        if ((in_XMM0_Qa <= *(double *)(in_RDI + 0xb8) - dVar5) ||
           (*(double *)(in_RDI + 0xb8) + dVar5 <= in_XMM0_Qa)) {
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                     CONCAT62(in_stack_ffffffffffffff32,uVar7));
          std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
                    ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     CONCAT62(in_stack_ffffffffffffff32,uVar7),ppMVar6);
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                     CONCAT62(in_stack_ffffffffffffff32,uVar7));
          std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
                    ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     CONCAT62(in_stack_ffffffffffffff32,uVar7),ppMVar6);
          std::vector<double,_std::allocator<double>_>::push_back
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          std::vector<double,_std::allocator<double>_>::push_back
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
        else {
          std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                    ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                     CONCAT62(in_stack_ffffffffffffff32,uVar7));
          std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
                    ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     CONCAT62(in_stack_ffffffffffffff32,uVar7),ppMVar6);
          std::vector<double,_std::allocator<double>_>::push_back
                    (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        }
      }
      else {
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   CONCAT62(in_stack_ffffffffffffff32,uVar7));
        std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
                  ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT62(in_stack_ffffffffffffff32,uVar7),ppMVar6);
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
    }
  }
  else {
    dVar5 = *(double *)(in_RDI + 0xa8);
    dVar1 = *(double *)(in_RDI + 0xb8);
    ppMVar6 = SUB108(_DAT_016afc00,0);
    uVar7 = (undefined2)((unkuint10)_DAT_016afc00 >> 0x40);
    RVar4 = literals::operator____rt((literals *)this_00,_DAT_016afc00);
    dVar5 = (dVar5 - dVar1) * RVar4;
    if ((in_XMM0_Qa <= *(double *)(in_RDI + 0xa8) - dVar5) ||
       (*(double *)(in_RDI + 0xb0) + dVar5 <= in_XMM0_Qa)) {
      bVar2 = std::operator!=((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                              CONCAT62(in_stack_ffffffffffffff32,uVar7),ppMVar6);
      if ((!bVar2) ||
         ((in_XMM0_Qa <= *(double *)(in_RDI + 0xb8) - dVar5 ||
          (*(double *)(in_RDI + 0xc0) + dVar5 <= in_XMM0_Qa)))) {
        Error_host((char *)in_stack_ffffffffffffff40);
      }
      else {
        std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   CONCAT62(in_stack_ffffffffffffff32,uVar7));
        std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
                  ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                   CONCAT62(in_stack_ffffffffffffff32,uVar7),ppMVar6);
        std::vector<double,_std::allocator<double>_>::push_back(in_RSI,in_stack_ffffffffffffff38);
      }
    }
    else {
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::get
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 CONCAT62(in_stack_ffffffffffffff32,uVar7));
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                 CONCAT62(in_stack_ffffffffffffff32,uVar7),ppMVar6);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
  }
  return;
}

Assistant:

void
StateData::getData (Vector<MultiFab*>& data,
                    Vector<Real>& datatime,
                    Real time) const
{
    data.clear();
    datatime.clear();

    if (desc->timeType() == StateDescriptor::Point)
    {
        BL_ASSERT(new_data != nullptr);
        if (old_data == nullptr)
        {
            data.push_back(new_data.get());
            datatime.push_back(new_time.start);
        }
        else
        {
            const Real teps = (new_time.start - old_time.start)*1.e-3_rt;
            if (time > new_time.start-teps && time < new_time.start+teps) {
                data.push_back(new_data.get());
                datatime.push_back(new_time.start);
            } else if (time > old_time.start-teps && time < old_time.start+teps) {
                data.push_back(old_data.get());
                datatime.push_back(old_time.start);
            } else {
                data.push_back(old_data.get());
                data.push_back(new_data.get());
                datatime.push_back(old_time.start);
                datatime.push_back(new_time.start);
            }
        }
    }
    else
    {
        const Real teps = (new_time.start - old_time.start)*1.e-3_rt;

        if (time > new_time.start-teps && time < new_time.stop+teps)
        {
            data.push_back(new_data.get());
            datatime.push_back(time);
        }
        else if (old_data != nullptr        &&
                 time > old_time.start-teps &&
                 time < old_time.stop+teps)
        {
            data.push_back(old_data.get());
            datatime.push_back(time);
        }
        else
        {
            amrex::Error("StateData::getData(): how did we get here?");
        }
    }
}